

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

int lws_mqtt_client_send_publish
              (lws *wsi,lws_mqtt_publish_param_t *pub,void *buf,uint32_t len,int is_complete)

{
  char cVar1;
  lws_context *plVar2;
  uint value;
  int iVar3;
  uchar *puVar4;
  uint8_t *puVar5;
  short sVar6;
  uint16_t uVar7;
  uint32_t rem_len;
  uint32_t vh_len;
  lws_mqtt_str_t mqtt_vh_payload;
  lws *nwsi;
  uint8_t *p;
  uint8_t *start;
  uint8_t *b;
  lws_context_per_thread *pt;
  int is_complete_local;
  uint32_t len_local;
  void *buf_local;
  lws_mqtt_publish_param_t *pub_local;
  lws *wsi_local;
  
  plVar2 = wsi->context;
  cVar1 = wsi->tsi;
  puVar4 = plVar2->pt[(int)cVar1].serv_buf;
  mqtt_vh_payload._8_8_ = lws_get_network_wsi(wsi);
  if (pub->topic == (char *)0x0) {
    __assert_fail("pub->topic",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/mqtt/mqtt.c"
                  ,0x64e,
                  "int lws_mqtt_client_send_publish(struct lws *, lws_mqtt_publish_param_t *, const void *, uint32_t, int)"
                 );
  }
  _lws_log(0x10,"%s: len = %d, is_complete = %d\n","lws_mqtt_client_send_publish",(ulong)len);
  if ((wsi->wsistate & 0xffff) != 0x119) {
    _lws_log(1,"%s: wsi %p: unknown state 0x%x\n","lws_mqtt_client_send_publish",wsi,
             (ulong)(wsi->wsistate & 0xffff));
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/mqtt/mqtt.c"
                  ,0x656,
                  "int lws_mqtt_client_send_publish(struct lws *, lws_mqtt_publish_param_t *, const void *, uint32_t, int)"
                 );
  }
  if (((byte)wsi->mqtt->field_0xfe >> 2 & 1) == 0) {
    p = puVar4 + 0x10;
    puVar4 = puVar4 + 0x11;
    iVar3 = lws_mqtt_fill_fixed_header(p,LMQCP_PUBLISH,'\0',pub->qos,'\0');
    if (iVar3 != 0) {
      _lws_log(1,"%s: Failed to fill fixed header\n","lws_mqtt_client_send_publish");
      return 1;
    }
    iVar3 = 0;
    if (pub->qos != QOS0) {
      iVar3 = 2;
    }
    iVar3 = pub->topic_len + 2 + iVar3;
    value = iVar3 + pub->payload_len;
    _lws_log(0x10,"%s: Remaining len = %d\n","lws_mqtt_client_send_publish",(ulong)value);
    if (wsi->context->pt_serv_buf_size - 0x10 <= iVar3 + len) {
      _lws_log(1,"%s: Payload is too big\n","lws_mqtt_client_send_publish");
      return 1;
    }
    iVar3 = lws_mqtt_vbi_encode(value,puVar4);
    lws_ser_wu16be(puVar4 + iVar3,pub->topic_len);
    sVar6 = 0;
    if (pub->qos != QOS0) {
      sVar6 = 2;
    }
    lws_mqtt_str_init((lws_mqtt_str_t *)&rem_len,puVar4 + iVar3 + 2,
                      pub->topic_len + sVar6 + (short)len,'\0');
    nwsi = (lws *)lws_mqtt_str_next((lws_mqtt_str_t *)&rem_len,(uint16_t *)0x0);
    lws_strncpy((char *)nwsi,pub->topic,(ulong)pub->topic_len + 1);
    iVar3 = lws_mqtt_str_advance((lws_mqtt_str_t *)&rem_len,(uint)pub->topic_len);
    if (iVar3 != 0) {
      _lws_log(1,"%s: a\n","lws_mqtt_client_send_publish");
      return 1;
    }
    if (pub->qos != QOS0) {
      nwsi = (lws *)lws_mqtt_str_next((lws_mqtt_str_t *)&rem_len,(uint16_t *)0x0);
      uVar7 = wsi->mqtt->pkt_id + 1;
      wsi->mqtt->pkt_id = uVar7;
      pub->packet_id = uVar7;
      wsi->mqtt->ack_pkt_id = uVar7;
      lws_ser_wu16be((uint8_t *)nwsi,pub->packet_id);
      iVar3 = lws_mqtt_str_advance((lws_mqtt_str_t *)&rem_len,2);
      if (iVar3 != 0) {
        _lws_log(1,"%s: b\n","lws_mqtt_client_send_publish");
        return 1;
      }
    }
    if ((pub->payload_len != 0) && (len != 0)) {
      puVar5 = lws_mqtt_str_next((lws_mqtt_str_t *)&rem_len,(uint16_t *)0x0);
      memcpy(puVar5,buf,(ulong)len);
      iVar3 = lws_mqtt_str_advance((lws_mqtt_str_t *)&rem_len,len);
      if (iVar3 != 0) {
        return 1;
      }
      puVar5 = lws_mqtt_str_next((lws_mqtt_str_t *)&rem_len,(uint16_t *)0x0);
      nwsi._0_4_ = (int)puVar5;
    }
    if (is_complete == 0) {
      wsi->mqtt->field_0xfe = wsi->mqtt->field_0xfe & 0xfb | 4;
      *(byte *)(*(long *)(mqtt_vh_payload._8_8_ + 0xb0) + 0xfe) =
           *(byte *)(*(long *)(mqtt_vh_payload._8_8_ + 0xb0) + 0xfe) & 0xfb | 4;
    }
  }
  else {
    nwsi._0_4_ = (int)buf + len;
    p = (uint8_t *)buf;
    if (is_complete != 0) {
      wsi->mqtt->field_0xfe = wsi->mqtt->field_0xfe & 0xfb;
    }
  }
  iVar3 = lws_write((lws *)mqtt_vh_payload._8_8_,p,(long)((int)nwsi - (int)p),LWS_WRITE_BINARY);
  if (iVar3 == (int)nwsi - (int)p) {
    if (is_complete == 0) {
      lws_callback_on_writable(wsi);
      wsi_local._4_4_ = 0;
    }
    else {
      *(byte *)(*(long *)(mqtt_vh_payload._8_8_ + 0xb0) + 0xfe) =
           *(byte *)(*(long *)(mqtt_vh_payload._8_8_ + 0xb0) + 0xfe) & 0xfb;
      wsi->mqtt->field_0xfe = wsi->mqtt->field_0xfe & 0xfb;
      if (pub->qos != QOS0) {
        wsi->mqtt->field_0xfe = wsi->mqtt->field_0xfe & 0xbf | 0x40;
      }
      if (pub->qos == QOS0) {
        iVar3 = (*wsi->protocol->callback)(wsi,LWS_CALLBACK_MQTT_ACK,wsi->user_space,(void *)0x0,0);
        if (iVar3 == 0) {
          wsi_local._4_4_ = 0;
        }
        else {
          _lws_log(1,"%s: ACK callback exited\n","lws_mqtt_client_send_publish");
          wsi_local._4_4_ = 1;
        }
      }
      else {
        (wsi->mqtt->sul_qos1_puback_wait).cb = lws_mqtt_publish_resend;
        __lws_sul_insert(&plVar2->pt[(int)cVar1].pt_sul_owner,&wsi->mqtt->sul_qos1_puback_wait,
                         3000000);
        wsi_local._4_4_ = 0;
      }
    }
  }
  else {
    _lws_log(1,"%s: write failed\n","lws_mqtt_client_send_publish");
    wsi_local._4_4_ = 1;
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_mqtt_client_send_publish(struct lws *wsi, lws_mqtt_publish_param_t *pub,
			     const void *buf, uint32_t len, int is_complete)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	uint8_t *b = (uint8_t *)pt->serv_buf, *start, *p;
	struct lws *nwsi = lws_get_network_wsi(wsi);
	lws_mqtt_str_t mqtt_vh_payload;
	uint32_t vh_len, rem_len;

	assert(pub->topic);

	lwsl_debug("%s: len = %d, is_complete = %d\n",
		   __func__, (int)len, (int)is_complete);

	if (lwsi_state(wsi) != LRS_ESTABLISHED) {
		lwsl_err("%s: wsi %p: unknown state 0x%x\n", __func__, wsi,
			 lwsi_state(wsi));
		assert(0);
		return 1;
	}

	if (wsi->mqtt->inside_payload) {
		/*
		 * Headers are filled, we are sending
		 * the payload - a buffer with LWS_PRE
		 * in front it.
		 */
		start = (uint8_t *)buf;
		p = start + len;
		if (is_complete)
			wsi->mqtt->inside_payload = 0;
		goto do_write;
	}

	start = b + LWS_PRE;
	p = start;
	/*
	 * Fill headers and the first chunk of the
	 * payload (if any)
	 */
	if (lws_mqtt_fill_fixed_header(p++, LMQCP_PUBLISH,
				       0, pub->qos, 0)) {
		lwsl_err("%s: Failed to fill fixed header\n", __func__);
		return 1;
	}

	/*
	 * Topic len field + Topic len + Packet ID
	 * (for QOS>0) + Payload len
	 */
	vh_len = 2 + pub->topic_len + ((pub->qos) ? 2 : 0);
	rem_len = vh_len + pub->payload_len;
	lwsl_debug("%s: Remaining len = %d\n", __func__, (int) rem_len);

	/* Will the chunk of payload fit? */
	if ((vh_len + len) >=
	    (wsi->context->pt_serv_buf_size - LWS_PRE)) {
		lwsl_err("%s: Payload is too big\n", __func__);
		return 1;
	}

	p += lws_mqtt_vbi_encode(rem_len, p);

	/* Topic's Len */
	lws_ser_wu16be(p, pub->topic_len);
	p += 2;

	/*
	 * Init lws_mqtt_str for "MQTT Variable
	 * Headers + payload" (only the supplied
	 * chuncked payload)
	 */
	lws_mqtt_str_init(&mqtt_vh_payload, (uint8_t *)p,
			  (pub->topic_len + ((pub->qos) ? 2 : 0) + len),
			  0);

	p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);
	lws_strncpy((char *)p, pub->topic, (size_t)pub->topic_len+1);
	if (lws_mqtt_str_advance(&mqtt_vh_payload, pub->topic_len)) {
		lwsl_err("%s: a\n", __func__);
		return 1;
	}

	/* Packet ID */
	if (pub->qos != QOS0) {
		p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);
		wsi->mqtt->ack_pkt_id = pub->packet_id = ++wsi->mqtt->pkt_id;
		lws_ser_wu16be(p, pub->packet_id);
		if (lws_mqtt_str_advance(&mqtt_vh_payload, 2)) {
			lwsl_err("%s: b\n", __func__);
			return 1;
		}
	}
	/*
	 * A non-empty Payload is expected and a chunk
	 * is present
	 */
	if (pub->payload_len && len) {
		p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);
		memcpy(p, buf, len);
		if (lws_mqtt_str_advance(&mqtt_vh_payload, len))
			return 1;
		p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);
	}

	if (!is_complete)
		nwsi->mqtt->inside_payload = wsi->mqtt->inside_payload = 1;

do_write:

	// lwsl_hexdump_err(start, lws_ptr_diff(p, start));

	if (lws_write(nwsi, start, lws_ptr_diff(p, start), LWS_WRITE_BINARY) !=
			lws_ptr_diff(p, start)) {
		lwsl_err("%s: write failed\n", __func__);
		return 1;
	}

	if (!is_complete) {
		/* still some more chunks to come... */
		lws_callback_on_writable(wsi);

		return 0;
	}

	wsi->mqtt->inside_payload = nwsi->mqtt->inside_payload = 0;

	if (pub->qos != QOS0)
		wsi->mqtt->unacked_publish = 1;

	/* this was the last part of the publish message */

	if (pub->qos == QOS0) {
		/*
		 * There won't be any real PUBACK, act like we got one
		 * so the user callback logic is the same for QoS0 or
		 * QoS1
		 */
		if (wsi->protocol->callback(wsi, LWS_CALLBACK_MQTT_ACK,
					    wsi->user_space, NULL, 0)) {
			lwsl_err("%s: ACK callback exited\n", __func__);
			return 1;
		}

		return 0;
	}

	/* For QoS1, if no PUBACK coming after 3s, we must RETRY the publish */

	wsi->mqtt->sul_qos1_puback_wait.cb = lws_mqtt_publish_resend;
	__lws_sul_insert(&pt->pt_sul_owner, &wsi->mqtt->sul_qos1_puback_wait,
			 3 * LWS_USEC_PER_SEC);

	return 0;
}